

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.hpp
# Opt level: O2

void duckdb::ParquetDecodeUtils::BitUnpackAlignedInternal<unsigned_int>
               (ByteBuffer *src,uint *dst,idx_t count,bitpacking_width_t width)

{
  idx_t i;
  ulong uVar1;
  ulong size;
  data_ptr_t src_00;
  uint aligned_data [32];
  uint32_t local_b8 [34];
  
  src_00 = src->ptr;
  if (((ulong)src_00 & 3) == 0) {
    BitpackingPrimitives::UnPackBuffer<unsigned_int>((data_ptr_t)dst,src_00,count,width,false);
    uVar1 = (width * count) / 8;
    src->len = src->len - uVar1;
    src->ptr = src->ptr + uVar1;
  }
  else {
    for (uVar1 = 0; uVar1 < count; uVar1 = uVar1 + 0x20) {
      size = (ulong)(ushort)(((uint)width << 5) / 8);
      FastMemcpy(local_b8,src_00,size);
      duckdb_fastpforlib::fastunpack(local_b8,dst,(uint)width);
      src->len = src->len - size;
      src_00 = src->ptr + size;
      src->ptr = src_00;
      dst = dst + 0x20;
    }
  }
  return;
}

Assistant:

static void BitUnpackAlignedInternal(ByteBuffer &src, T *dst, const idx_t count, const bitpacking_width_t width) {
		D_ASSERT(count % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE == 0);
		if (cast_pointer_to_uint64(src.ptr) % sizeof(T) == 0) {
			// Fast path: aligned
			BitpackingPrimitives::UnPackBuffer<T>(data_ptr_cast(dst), src.ptr, count, width);
			src.unsafe_inc(count * width / BITPACK_DLEN);
			return;
		}

		for (idx_t i = 0; i < count; i += BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE) {
			const auto next_read = BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE * width / BITPACK_DLEN;

			// Buffer for alignment
			T aligned_data[BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE];

			// Copy over to aligned buffer
			FastMemcpy(aligned_data, src.ptr, next_read);

			// Unpack
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(dst), data_ptr_cast(aligned_data), width, true);

			src.unsafe_inc(next_read);
			dst += BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;
		}
	}